

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *pFVar1;
  _Rb_tree_node_base *p_Var2;
  ostringstream *poVar3;
  Precision PVar4;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *pBVar7;
  int iVar8;
  MessageBuilder *this_01;
  undefined8 uVar9;
  IVal *pIVar10;
  IVal *pIVar11;
  size_t sVar12;
  long lVar13;
  TestStatus *__return_storage_ptr___00;
  string *this_02;
  bool bVar14;
  IVal reference1;
  int numErrors;
  IVal in2;
  FuncSet funcs;
  Environment env;
  FloatFormat highpFmt;
  void *outputArr [2];
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  outputs;
  IVal in3;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal in0;
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa88;
  IVal local_571;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  *local_570;
  TestLog *local_568;
  ulong local_560;
  uint local_554;
  size_t local_550;
  FloatFormat *local_548;
  string local_540;
  TestStatus *local_520;
  undefined1 local_518 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  _Rb_tree_node_base *local_4f8;
  double local_4f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4b8;
  FloatFormat local_488;
  pointer local_458;
  pointer local_450;
  pointer local_448;
  pointer local_440;
  pointer local_438;
  pointer local_430;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>
  local_428;
  string local_3f8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_3d8;
  undefined1 local_378 [32];
  IVal *local_358;
  Precision local_350;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_348;
  undefined4 local_340;
  ResultCollector local_1f8;
  Matrix<tcu::Interval,_2,_2> local_1a8 [3];
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar4 = (this->m_caseCtx).precision;
  sVar12 = (this->m_caseCtx).numRandoms;
  local_520 = __return_storage_ptr__;
  iVar8 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_548 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_3d8,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar4,(Precision)sVar12,(ulong)(iVar8 + 0xdeadbeef),
             in_stack_fffffffffffffa88);
  sVar12 = (long)local_3d8.in0.
                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_3d8.in0.
                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_428,sVar12);
  local_488.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_488.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_488.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_488.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_488.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_488.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_488.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_488.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_488._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_554 = 0;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b8._M_impl.super__Rb_tree_header._M_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_550 = sVar12;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_568 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_448 = local_3d8.in0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_440 = local_3d8.in1.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_438 = local_3d8.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_430 = local_3d8.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_458 = local_428.out0.
              super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_450 = local_428.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_378 + 8);
  local_378._0_8_ = local_568;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::operator<<((ostream *)poVar3,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_378,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_518 + 8);
  local_518._8_4_ = _S_red;
  local_508._M_allocated_capacity = 0;
  local_4f0 = 0.0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_508._8_8_ = p_Var2;
  local_4f8 = p_Var2;
  (*pSVar5->_vptr_Statement[4])(pSVar5,local_518);
  for (uVar9 = local_508._8_8_; (_Rb_tree_node_base *)uVar9 != p_Var2;
      uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9)) {
    (**(code **)(**(long **)(uVar9 + 0x20) + 0x30))(*(long **)(uVar9 + 0x20),local_1a8);
  }
  if (local_4f0 != 0.0) {
    poVar3 = (ostringstream *)(local_378 + 8);
    local_378._0_8_ = local_568;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)poVar3,(string *)&local_540);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  sVar12 = local_550;
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar11 = (IVal *)&local_458;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,local_550 & 0xffffffff,&local_448,pIVar11,0);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_378);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(local_1a8);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_518);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_4b8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_378);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_4b8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_3f8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_4b8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>.m_ptr,
             (IVal *)local_518);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_571);
  lVar13 = 0;
  poVar3 = (ostringstream *)(local_378 + 8);
  local_560 = 0;
  local_570 = this;
  while (bVar14 = sVar12 != 0, sVar12 = sVar12 - 1, bVar14) {
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix(local_1a8);
    pFVar1 = local_548;
    round<tcu::Matrix<float,2,2>>
              ((IVal *)local_518,(shaderexecutor *)local_548,
               (FloatFormat *)
               ((long)((local_3d8.in0.
                        super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar13),(Matrix<float,_2,_2> *)pIVar11);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_378,pFVar1,(IVal *)local_518);
    pIVar10 = Environment::lookup<tcu::Matrix<float,2,2>>
                        ((Environment *)&local_4b8,
                         (local_570->m_variables).in0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                         .m_ptr);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(pIVar10,(Matrix<tcu::Interval,_2,_2> *)local_378);
    pFVar1 = local_548;
    round<tcu::Matrix<float,2,2>>
              ((IVal *)local_518,(shaderexecutor *)local_548,
               (FloatFormat *)
               ((long)((local_3d8.in1.
                        super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar13),(Matrix<float,_2,_2> *)pIVar11);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_378,pFVar1,(IVal *)local_518);
    pIVar11 = Environment::lookup<tcu::Matrix<float,2,2>>
                        ((Environment *)&local_4b8,
                         (local_570->m_variables).in1.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                         .m_ptr);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(pIVar11,(Matrix<tcu::Interval,_2,_2> *)local_378);
    pBVar7 = local_570;
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_4b8,
               (local_570->m_variables).in2.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              ((Environment *)&local_4b8,
               (pBVar7->m_variables).in3.
               super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
               m_ptr);
    local_350 = (pBVar7->m_caseCtx).precision;
    pIVar11 = (IVal *)local_548->m_maxValue;
    local_378._0_8_ = *(undefined8 *)local_548;
    local_378._8_4_ = local_548->m_fractionBits;
    local_378._12_4_ = local_548->m_hasSubnormal;
    local_378._16_4_ = local_548->m_hasInf;
    local_378._20_4_ = local_548->m_hasNaN;
    local_378[0x18] = local_548->m_exactPrecision;
    local_378._25_3_ = *(undefined3 *)&local_548->field_0x19;
    local_378._28_4_ = *(undefined4 *)&local_548->field_0x1c;
    local_340 = 0;
    pSVar5 = (pBVar7->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    local_358 = pIVar11;
    local_348 = &local_4b8;
    (*pSVar5->_vptr_Statement[3])(pSVar5,(MessageBuilder *)local_378);
    pIVar10 = Environment::lookup<tcu::Matrix<float,2,2>>
                        ((Environment *)&local_4b8,
                         (pBVar7->m_variables).out0.
                         super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                         .m_ptr);
    ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
              ((IVal *)local_378,&local_488,pIVar10);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(local_1a8,(Matrix<tcu::Interval,_2,_2> *)local_378);
    bVar14 = ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::
             doContains(local_1a8,
                        (Matrix<float,_2,_2> *)
                        ((long)((local_428.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                               m_data + lVar13));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_378,"Shader output 0 is outside acceptable range",
               (allocator<char> *)local_518);
    bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_378);
    std::__cxx11::string::~string((string *)local_378);
    if (!bVar14) {
      local_554 = (int)local_560 + 1;
      local_560 = (ulong)local_554;
      if ((int)local_554 < 0x65) {
        local_378._0_8_ = local_568;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        std::operator<<((ostream *)poVar3,"Failed");
        std::operator<<((ostream *)poVar3," sample:\n");
        std::operator<<((ostream *)poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)local_518,
                   (string *)
                   &((local_570->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)poVar3,(string *)local_518);
        std::operator<<((ostream *)poVar3," = ");
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_540,(shaderexecutor *)&local_488,
                   (FloatFormat *)
                   ((long)((local_3d8.in0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar13),(Matrix<float,_2,_2> *)pIVar11);
        std::operator<<((ostream *)poVar3,(string *)&local_540);
        std::operator<<((ostream *)poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)local_518);
        std::operator<<((ostream *)poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)local_518,
                   (string *)
                   &((local_570->m_variables).in1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)poVar3,(string *)local_518);
        std::operator<<((ostream *)poVar3," = ");
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_540,(shaderexecutor *)&local_488,
                   (FloatFormat *)
                   ((long)((local_3d8.in1.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar13),(Matrix<float,_2,_2> *)pIVar11);
        std::operator<<((ostream *)poVar3,(string *)&local_540);
        std::operator<<((ostream *)poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)local_518);
        std::operator<<((ostream *)poVar3,"\t");
        std::__cxx11::string::string
                  ((string *)local_518,
                   (string *)
                   &((local_570->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_2>_>_>
                    .m_ptr)->m_name);
        std::operator<<((ostream *)poVar3,(string *)local_518);
        std::operator<<((ostream *)poVar3," = ");
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_540,(shaderexecutor *)&local_488,
                   (FloatFormat *)
                   ((long)((local_428.out0.
                            super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar13),(Matrix<float,_2,_2> *)pIVar11);
        std::operator<<((ostream *)poVar3,(string *)&local_540);
        std::operator<<((ostream *)poVar3,"\n");
        std::operator<<((ostream *)poVar3,"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_3f8,(shaderexecutor *)&local_488,(FloatFormat *)local_1a8,pIVar11);
        std::operator<<((ostream *)poVar3,(string *)&local_3f8);
        std::operator<<((ostream *)poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_540);
        std::__cxx11::string::~string((string *)local_518);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
      }
    }
    lVar13 = lVar13 + 0x10;
  }
  if ((int)local_560 < 0x65) {
    if ((int)local_560 == 0) {
      poVar3 = (ostringstream *)(local_378 + 8);
      local_378._0_8_ = local_568;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::operator<<((ostream *)poVar3,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<((ostream *)poVar3," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_378,"Pass",(allocator<char> *)local_1a8);
      __return_storage_ptr___00 = local_520;
      tcu::TestStatus::pass(local_520,(string *)local_378);
      this_02 = (string *)local_378;
      goto LAB_008152f5;
    }
  }
  else {
    poVar3 = (ostringstream *)(local_378 + 8);
    local_378._0_8_ = local_568;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,"(Skipped ");
    std::ostream::operator<<(poVar3,(int)local_560 + -100);
    std::operator<<((ostream *)poVar3," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
  }
  poVar3 = (ostringstream *)(local_378 + 8);
  local_378._0_8_ = local_568;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::ostream::operator<<(poVar3,(int)local_560);
  std::operator<<((ostream *)poVar3,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<((ostream *)poVar3," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_378,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  de::toString<int>((string *)local_1a8,(int *)&local_554);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_518," test failed. Check log for the details",
             (allocator<char> *)&local_540);
  __return_storage_ptr___00 = local_520;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)local_378);
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_518);
  this_02 = (string *)local_1a8;
LAB_008152f5:
  std::__cxx11::string::~string(this_02);
  tcu::ResultCollector::~ResultCollector(&local_1f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4b8);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void>_>::
  ~Outputs(&local_428);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&local_3d8);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}